

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall Assimp::SMDImporter::CreateOutputMeshes(SMDImporter *this)

{
  aiFace *paVar1;
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *pvVar2;
  aiMatrix4x4 *paVar3;
  pointer puVar4;
  pointer puVar5;
  iterator iVar6;
  Vertex *pVVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  pointer pbVar22;
  aiMesh **ppaVar23;
  aiMesh *paVar24;
  ulong uVar25;
  ulong *puVar26;
  aiFace *paVar27;
  aiVector3D *__s;
  aiVector3D *__s_00;
  uint *puVar28;
  Logger *pLVar29;
  pointer ppVar30;
  aiBone **ppaVar31;
  aiBone *paVar32;
  aiVertexWeight *__s_01;
  ulong uVar33;
  pointer pBVar34;
  pointer pbVar35;
  long lVar36;
  pointer pBVar37;
  uint uVar38;
  pointer ppVar39;
  pointer pFVar40;
  iterator iVar41;
  ulong *puVar42;
  uint uVar43;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  aiScene *paVar44;
  uint iVert;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar45;
  long lVar46;
  ulong uVar47;
  uint i;
  ulong uVar48;
  bool bVar49;
  uint local_cc;
  undefined8 local_c8;
  ulong local_c0;
  Vertex *local_b8;
  ulong *local_b0;
  uint local_a4;
  ulong local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  aiVector3D *local_90;
  undefined1 local_88 [8];
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ulong *local_68;
  ulong *local_60;
  aiVector3D *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  aiVector3D *local_40;
  aiMesh **local_38;
  
  pbVar35 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar22 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar35 == pbVar22) {
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_88 = (undefined1  [8])&local_78;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->aszTextures,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88);
    }
    pbVar35 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar22 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->pScene->mNumMeshes = (uint)((ulong)((long)pbVar22 - (long)pbVar35) >> 5);
  paVar44 = this->pScene;
  ppaVar23 = (aiMesh **)operator_new__((ulong)paVar44->mNumMeshes << 3);
  paVar44->mMeshes = ppaVar23;
  paVar44 = this->pScene;
  uVar38 = paVar44->mNumMeshes;
  uVar33 = (ulong)uVar38;
  local_68 = (ulong *)operator_new__(uVar33 * 0x18 + 8);
  *local_68 = uVar33;
  this_01 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_68 + 1);
  if (uVar38 != 0) {
    memset(this_01,0,((uVar33 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  uVar48 = 0;
  uVar33 = (ulong)(uint)((int)((ulong)((long)(this->asTriangles).
                                             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->asTriangles).
                                            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x3d70a3d7) / (ulong)paVar44->mNumMeshes;
  local_cc = (int)(uVar33 >> 1) + (int)uVar33;
  local_98 = this_01;
  do {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_01,(ulong)local_cc);
    uVar48 = uVar48 + 1;
    paVar44 = this->pScene;
    this_01 = this_01 + 1;
  } while (uVar48 < paVar44->mNumMeshes);
  pFVar40 = (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_cc = 0;
  if (pFVar40 !=
      (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    puVar26 = local_68 + 0x2ffffffff;
    puVar42 = local_68 + 0x300000000;
    pvVar45 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(local_68 + 0x2fffffffe);
    do {
      uVar33 = (ulong)pFVar40->iTexture;
      if (uVar33 == 0xffffffff) {
        local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffff00000000);
        iVar41._M_current = (uint *)*puVar26;
        this_00 = pvVar45;
        if (iVar41._M_current == (uint *)*puVar42) {
LAB_005f4350:
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar41,
                     (uint *)local_88);
        }
        else {
          *iVar41._M_current = 0;
          *puVar26 = *puVar26 + 4;
        }
      }
      else {
        if (uVar33 < (ulong)((long)(this->aszTextures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->aszTextures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(local_98 + uVar33);
          iVar41._M_current = *(uint **)(this_00 + 8);
          if (iVar41._M_current == *(uint **)(this_00 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(this_00,iVar41,&local_cc);
            goto LAB_005f4366;
          }
          *iVar41._M_current = local_cc;
        }
        else {
          pLVar29 = DefaultLogger::get();
          Logger::info(pLVar29,"[SMD/VTA] Material index overflow in face");
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    (local_98 + pFVar40->iTexture);
          uVar38 = (int)((ulong)((long)(this->aszTextures).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->aszTextures).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          local_88._0_4_ = uVar38;
          iVar41._M_current = *(uint **)(this_00 + 8);
          if (iVar41._M_current == *(uint **)(this_00 + 0x10)) goto LAB_005f4350;
          *iVar41._M_current = uVar38;
        }
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
      }
LAB_005f4366:
      pFVar40 = pFVar40 + 1;
      local_cc = local_cc + 1;
    } while (pFVar40 !=
             (this->asTriangles).
             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
             super__Vector_impl_data._M_finish);
    paVar44 = this->pScene;
  }
  if (paVar44->mNumMeshes != 0) {
    uVar38 = 0;
    do {
      local_a4 = uVar38;
      paVar24 = (aiMesh *)operator_new(0x520);
      paVar24->mPrimitiveTypes = 0;
      paVar24->mNumVertices = 0;
      paVar24->mNumFaces = 0;
      memset(&paVar24->mVertices,0,0xcc);
      paVar24->mBones = (aiBone **)0x0;
      paVar24->mMaterialIndex = 0;
      (paVar24->mName).length = 0;
      (paVar24->mName).data[0] = '\0';
      memset((paVar24->mName).data + 1,0x1b,0x3ff);
      paVar24->mNumAnimMeshes = 0;
      paVar24->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar24->mMethod = 0;
      (paVar24->mAABB).mMin.x = 0.0;
      (paVar24->mAABB).mMin.y = 0.0;
      (paVar24->mAABB).mMin.z = 0.0;
      (paVar24->mAABB).mMax.x = 0.0;
      (paVar24->mAABB).mMax.y = 0.0;
      (paVar24->mAABB).mMax.z = 0.0;
      memset(paVar24->mColors,0,0xa0);
      ppaVar23 = paVar44->mMeshes;
      uVar33 = (ulong)local_a4;
      ppaVar23[uVar33] = paVar24;
      puVar4 = local_98[uVar33].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar5 = local_98[uVar33].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar4 == puVar5) {
        __assert_fail("!aaiFaces[i].empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SMD/SMDLoader.cpp"
                      ,0x10c,"void Assimp::SMDImporter::CreateOutputMeshes()");
      }
      local_50 = local_98 + uVar33;
      paVar24->mPrimitiveTypes = 4;
      ppaVar23[uVar33]->mNumVertices = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2) * 3;
      ppaVar23[uVar33]->mNumFaces =
           (uint)((ulong)((long)(local_50->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_50->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      ppaVar23[uVar33]->mMaterialIndex = local_a4;
      pBVar34 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar37 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar46 = (long)pBVar37 - (long)pBVar34 >> 4;
      uVar47 = lVar46 * -0x71c71c71c71c71c7;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar47;
      uVar48 = SUB168(auVar9 * ZEXT816(0x18),0);
      uVar25 = uVar48 + 8;
      if (0xfffffffffffffff7 < uVar48) {
        uVar25 = 0xffffffffffffffff;
      }
      if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
        uVar25 = 0xffffffffffffffff;
      }
      local_60 = (ulong *)operator_new__(uVar25);
      puVar26 = local_60 + 1;
      *local_60 = uVar47;
      local_c0 = uVar33;
      if (pBVar37 != pBVar34) {
        lVar36 = 0;
        do {
          *(undefined8 *)((long)puVar26 + lVar36) = 0;
          ((undefined8 *)((long)puVar26 + lVar36))[1] = 0;
          *(undefined8 *)((long)local_60 + lVar36 + 0x18) = 0;
          lVar36 = lVar36 + 0x18;
        } while (lVar46 * 0x5555555555555558 != lVar36);
        if (pBVar37 != pBVar34) {
          uVar48 = 0;
          uVar25 = 1;
          do {
            std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       *)(puVar26 + uVar48 * 3),ppaVar23[uVar33]->mNumVertices / uVar47);
            uVar47 = ((long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
            bVar49 = uVar25 <= uVar47;
            lVar46 = uVar47 - uVar25;
            uVar48 = uVar25;
            uVar25 = (ulong)((int)uVar25 + 1);
          } while (bVar49 && lVar46 != 0);
        }
      }
      uVar33 = (ulong)ppaVar23[uVar33]->mNumFaces;
      local_b0 = puVar26;
      puVar26 = (ulong *)operator_new__(uVar33 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar26 + 1);
      *puVar26 = uVar33;
      if (uVar33 != 0) {
        paVar27 = paVar1;
        do {
          paVar27->mNumIndices = 0;
          paVar27->mIndices = (uint *)0x0;
          paVar27 = paVar27 + 1;
        } while (paVar27 != paVar1 + uVar33);
      }
      ppaVar23[local_c0]->mFaces = paVar1;
      uVar38 = ppaVar23[local_c0]->mNumVertices;
      uVar33 = (ulong)uVar38 * 0xc;
      __s = (aiVector3D *)operator_new__(uVar33);
      puVar26 = local_b0;
      if ((ulong)uVar38 != 0) {
        memset(__s,0,((uVar33 - 0xc) / 0xc) * 0xc + 0xc);
      }
      uVar33 = local_c0;
      ppaVar23[local_c0]->mNormals = __s;
      uVar38 = ppaVar23[local_c0]->mNumVertices;
      local_c8 = (ulong)uVar38 * 0xc;
      local_90 = (aiVector3D *)operator_new__(local_c8);
      if ((ulong)uVar38 != 0) {
        memset(local_90,0,((local_c8 - 0xc) / 0xc) * 0xc + 0xc);
      }
      ppaVar23[uVar33]->mVertices = local_90;
      if (this->bHasUVs == true) {
        uVar38 = ppaVar23[uVar33]->mNumVertices;
        local_c8 = (ulong)uVar38 * 0xc;
        __s_00 = (aiVector3D *)operator_new__(local_c8);
        if ((ulong)uVar38 != 0) {
          memset(__s_00,0,((local_c8 - 0xc) / 0xc) * 0xc + 0xc);
        }
        ppaVar23[uVar33]->mTextureCoords[0] = __s_00;
        ppaVar23[uVar33]->mNumUVComponents[0] = 2;
      }
      else {
        __s_00 = (aiVector3D *)0x0;
      }
      local_cc = 0;
      paVar24 = ppaVar23[uVar33];
      if (paVar24->mNumFaces != 0) {
        uVar48 = 0;
        local_38 = ppaVar23;
        do {
          puVar28 = (uint *)operator_new__(0xc);
          local_a0 = uVar48 * 0x10;
          ppaVar23[uVar33]->mFaces[uVar48].mIndices = puVar28;
          ppaVar23[uVar33]->mFaces[uVar48].mNumIndices = 3;
          uVar38 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar48];
          pFVar40 = (this->asTriangles).
                    super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_90->z = pFVar40[uVar38].avVertices[0].pos.z;
          fVar13 = pFVar40[uVar38].avVertices[0].pos.y;
          local_90->x = pFVar40[uVar38].avVertices[0].pos.x;
          local_90->y = fVar13;
          local_90[1].z = pFVar40[uVar38].avVertices[1].pos.z;
          fVar13 = pFVar40[uVar38].avVertices[1].pos.y;
          local_90[1].x = pFVar40[uVar38].avVertices[1].pos.x;
          local_90[1].y = fVar13;
          local_90[2].z = pFVar40[uVar38].avVertices[2].pos.z;
          fVar13 = pFVar40[uVar38].avVertices[2].pos.y;
          local_90[2].x = pFVar40[uVar38].avVertices[2].pos.x;
          local_90[2].y = fVar13;
          __s->z = pFVar40[uVar38].avVertices[0].nor.z;
          fVar13 = pFVar40[uVar38].avVertices[0].nor.y;
          __s->x = pFVar40[uVar38].avVertices[0].nor.x;
          __s->y = fVar13;
          fVar13 = pFVar40[uVar38].avVertices[1].nor.y;
          __s[1].x = pFVar40[uVar38].avVertices[1].nor.x;
          __s[1].y = fVar13;
          __s[1].z = pFVar40[uVar38].avVertices[1].nor.z;
          fVar13 = pFVar40[uVar38].avVertices[2].nor.y;
          __s[2].x = pFVar40[uVar38].avVertices[2].nor.x;
          __s[2].y = fVar13;
          __s[2].z = pFVar40[uVar38].avVertices[2].nor.z;
          if (__s_00 == (aiVector3D *)0x0) {
            local_58 = (aiVector3D *)0x0;
          }
          else {
            __s_00->z = pFVar40[uVar38].avVertices[0].uv.z;
            fVar13 = pFVar40[uVar38].avVertices[0].uv.y;
            __s_00->x = pFVar40[uVar38].avVertices[0].uv.x;
            __s_00->y = fVar13;
            fVar13 = pFVar40[uVar38].avVertices[1].uv.y;
            __s_00[1].x = pFVar40[uVar38].avVertices[1].uv.x;
            __s_00[1].y = fVar13;
            __s_00[1].z = pFVar40[uVar38].avVertices[1].uv.z;
            fVar13 = pFVar40[uVar38].avVertices[2].uv.y;
            __s_00[2].x = pFVar40[uVar38].avVertices[2].uv.x;
            __s_00[2].y = fVar13;
            __s_00[2].z = pFVar40[uVar38].avVertices[2].uv.z;
            local_58 = __s_00 + 3;
          }
          local_b8 = pFVar40[uVar38].avVertices;
          local_90 = local_90 + 3;
          local_40 = __s + 3;
          lVar46 = 0;
          local_48 = uVar48;
          do {
            pVVar7 = local_b8;
            ppVar30 = *(pointer *)
                       &local_b8[lVar46].aiBoneLinks.
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl;
            if (*(pointer *)
                 ((long)&local_b8[lVar46].aiBoneLinks.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl + 8) == ppVar30) {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
LAB_005f49d8:
              puVar26 = local_b0;
              uVar48 = (ulong)pVVar7[lVar46].iParentNode;
              if (uVar48 != 0xffffffff) {
                uVar25 = ((long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x71c71c71c71c71c7;
                if (uVar25 < uVar48 || uVar25 - uVar48 == 0) {
                  pLVar29 = DefaultLogger::get();
                  Logger::error(pLVar29,
                                "[SMD/VTA] Bone index overflow. The index of the vertex parent bone is invalid. The remaining weights will be normalized to 1.0"
                               );
                  if (((float)local_c8 != 0.0) || (NAN((float)local_c8))) {
                    ppVar30 = pVVar7[lVar46].aiBoneLinks.
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    ppVar39 = *(pointer *)
                               ((long)&pVVar7[lVar46].aiBoneLinks.
                                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                       ._M_impl + 8);
                    if (ppVar39 != ppVar30) {
                      uVar38 = 1;
                      uVar48 = 0;
                      do {
                        uVar48 = (ulong)ppVar30[uVar48].first;
                        uVar25 = ((long)(this->asBones).
                                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->asBones).
                                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x71c71c71c71c71c7;
                        if (uVar48 <= uVar25 && uVar25 - uVar48 != 0) {
                          *(float *)(puVar26[uVar48 * 3 + 1] - 4) =
                               *(float *)(puVar26[uVar48 * 3 + 1] - 4) * (1.0 / (float)local_c8);
                          ppVar30 = pVVar7[lVar46].aiBoneLinks.
                                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          ppVar39 = *(pointer *)
                                     ((long)&pVVar7[lVar46].aiBoneLinks.
                                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                             ._M_impl + 8);
                        }
                        uVar48 = (ulong)uVar38;
                        uVar38 = uVar38 + 1;
                      } while (uVar48 < (ulong)((long)ppVar39 - (long)ppVar30 >> 3));
                    }
                  }
                }
                else {
                  pvVar2 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_b0 + uVar48 * 3);
                  local_88._4_4_ = 1.0 - (float)local_c8;
                  local_88._0_4_ = local_cc;
                  iVar6._M_current = *(pair<unsigned_int,_float> **)(pvVar2 + 8);
                  if (iVar6._M_current == *(pair<unsigned_int,_float> **)(pvVar2 + 0x10)) {
                    std::
                    vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    ::_M_realloc_insert<std::pair<unsigned_int,float>>
                              (pvVar2,iVar6,(pair<unsigned_int,_float> *)local_88);
                  }
                  else {
                    (iVar6._M_current)->first = local_cc;
                    (iVar6._M_current)->second = 1.0 - (float)local_c8;
                    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
                  }
                }
              }
            }
            else {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
              uVar33 = 0;
              uVar48 = 1;
              do {
                uVar25 = (ulong)ppVar30[uVar33].first;
                uVar47 = ((long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x71c71c71c71c71c7;
                if ((uVar47 < uVar25 || uVar47 - uVar25 == 0) ||
                   (ppVar30[uVar33].first == pVVar7[lVar46].iParentNode)) {
                  pLVar29 = DefaultLogger::get();
                  Logger::error(pLVar29,
                                "[SMD/VTA] Bone index overflow. The bone index will be ignored, the weight will be assigned to the vertex\' parent node"
                               );
                }
                else {
                  pvVar2 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_b0 + uVar25 * 3);
                  local_88._4_4_ = ppVar30[uVar33].second;
                  local_88._0_4_ = local_cc;
                  iVar6._M_current = *(pair<unsigned_int,_float> **)(pvVar2 + 8);
                  if (iVar6._M_current == *(pair<unsigned_int,_float> **)(pvVar2 + 0x10)) {
                    std::
                    vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    ::_M_realloc_insert<std::pair<unsigned_int,float>>
                              (pvVar2,iVar6,(pair<unsigned_int,_float> *)local_88);
                  }
                  else {
                    (iVar6._M_current)->first = local_cc;
                    (iVar6._M_current)->second = (float)local_88._4_4_;
                    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
                  }
                  local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8 + ppVar30[uVar33].second);
                }
                ppVar30 = pVVar7[lVar46].aiBoneLinks.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar49 = uVar48 < (ulong)((long)*(pointer *)
                                                 ((long)&pVVar7[lVar46].aiBoneLinks.
                                                                                                                  
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl + 8) - (long)ppVar30 >> 3);
                uVar33 = uVar48;
                uVar48 = (ulong)((int)uVar48 + 1);
              } while (bVar49);
              puVar26 = local_b0;
              ppaVar23 = local_38;
              uVar33 = local_c0;
              if ((float)local_c8 < 0.975) goto LAB_005f49d8;
            }
            uVar38 = local_cc + 1;
            *(uint *)(*(long *)((long)&ppaVar23[uVar33]->mFaces->mIndices + local_a0) + lVar46 * 4)
                 = local_cc;
            lVar46 = lVar46 + 1;
            local_cc = uVar38;
          } while (lVar46 != 3);
          uVar48 = local_48 + 1;
          paVar24 = ppaVar23[uVar33];
          __s = local_40;
          __s_00 = local_58;
        } while (uVar48 < paVar24->mNumFaces);
      }
      local_cc = 0;
      lVar46 = (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar46 != 0) {
        uVar48 = (lVar46 >> 4) * -0x71c71c71c71c71c7;
        puVar42 = local_60 + 2;
        uVar38 = 0;
        uVar43 = 1;
        do {
          if (puVar42[-1] != *puVar42) {
            uVar38 = uVar38 + 1;
            local_cc = uVar38;
          }
          uVar25 = (ulong)uVar43;
          puVar42 = puVar42 + 3;
          uVar43 = uVar43 + 1;
        } while (uVar25 <= uVar48 && uVar48 - uVar25 != 0);
        if (uVar38 != 0) {
          paVar24->mNumBones = uVar38;
          ppaVar31 = (aiBone **)operator_new__((ulong)ppaVar23[uVar33]->mNumBones << 3);
          ppaVar23[uVar33]->mBones = ppaVar31;
          local_cc = 0;
          pBVar34 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar37 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pBVar37 != pBVar34) {
            uVar38 = 0;
            uVar48 = 0;
            do {
              if (puVar26[uVar48 * 3] != puVar26[uVar48 * 3 + 1]) {
                puVar26 = puVar26 + uVar48 * 3;
                local_c8 = uVar48;
                local_a0 = uVar48;
                paVar32 = (aiBone *)operator_new(0x450);
                (paVar32->mName).length = 0;
                (paVar32->mName).data[0] = '\0';
                memset((paVar32->mName).data + 1,0x1b,0x3ff);
                paVar32->mNumWeights = 0;
                paVar32->mWeights = (aiVertexWeight *)0x0;
                (paVar32->mOffsetMatrix).a1 = 1.0;
                (paVar32->mOffsetMatrix).a2 = 0.0;
                (paVar32->mOffsetMatrix).a3 = 0.0;
                (paVar32->mOffsetMatrix).a4 = 0.0;
                (paVar32->mOffsetMatrix).b1 = 0.0;
                (paVar32->mOffsetMatrix).b2 = 1.0;
                (paVar32->mOffsetMatrix).b3 = 0.0;
                (paVar32->mOffsetMatrix).b4 = 0.0;
                (paVar32->mOffsetMatrix).c1 = 0.0;
                (paVar32->mOffsetMatrix).c2 = 0.0;
                (paVar32->mOffsetMatrix).c3 = 1.0;
                (paVar32->mOffsetMatrix).c4 = 0.0;
                (paVar32->mOffsetMatrix).d1 = 0.0;
                (paVar32->mOffsetMatrix).d2 = 0.0;
                (paVar32->mOffsetMatrix).d3 = 0.0;
                (paVar32->mOffsetMatrix).d4 = 1.0;
                ppaVar31 = ppaVar23[uVar33]->mBones;
                ppaVar31[uVar38] = paVar32;
                paVar32->mNumWeights = (uint)(puVar26[1] - *puVar26 >> 3);
                uVar43 = ppaVar31[uVar38]->mNumWeights;
                local_b8 = (Vertex *)((ulong)uVar43 * 8);
                __s_01 = (aiVertexWeight *)operator_new__((ulong)local_b8);
                if ((ulong)uVar43 != 0) {
                  memset(__s_01,0,(size_t)local_b8);
                }
                ppaVar31[uVar38]->mWeights = __s_01;
                pBVar34 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                paVar32 = ppaVar31[uVar38];
                paVar3 = &pBVar34[local_c8].mOffsetMatrix;
                fVar18 = paVar3->a1;
                fVar19 = paVar3->a2;
                fVar20 = paVar3->a3;
                fVar21 = paVar3->a4;
                pBVar37 = pBVar34 + local_c8;
                fVar16 = (pBVar37->mOffsetMatrix).b1;
                fVar17 = (pBVar37->mOffsetMatrix).b2;
                uVar10 = *(undefined8 *)(&(pBVar37->mOffsetMatrix).b1 + 2);
                pBVar37 = pBVar34 + local_c8;
                fVar14 = (pBVar37->mOffsetMatrix).c1;
                fVar15 = (pBVar37->mOffsetMatrix).c2;
                uVar11 = *(undefined8 *)(&(pBVar37->mOffsetMatrix).c1 + 2);
                pBVar34 = pBVar34 + local_c8;
                fVar13 = (pBVar34->mOffsetMatrix).d2;
                uVar12 = *(undefined8 *)(&(pBVar34->mOffsetMatrix).d1 + 2);
                (paVar32->mOffsetMatrix).d1 = (pBVar34->mOffsetMatrix).d1;
                (paVar32->mOffsetMatrix).d2 = fVar13;
                *(undefined8 *)&(paVar32->mOffsetMatrix).d3 = uVar12;
                (paVar32->mOffsetMatrix).c1 = fVar14;
                (paVar32->mOffsetMatrix).c2 = fVar15;
                *(undefined8 *)&(paVar32->mOffsetMatrix).c3 = uVar11;
                (paVar32->mOffsetMatrix).b1 = fVar16;
                (paVar32->mOffsetMatrix).b2 = fVar17;
                *(undefined8 *)&(paVar32->mOffsetMatrix).b3 = uVar10;
                (paVar32->mOffsetMatrix).a1 = fVar18;
                (paVar32->mOffsetMatrix).a2 = fVar19;
                (paVar32->mOffsetMatrix).a3 = fVar20;
                (paVar32->mOffsetMatrix).a4 = fVar21;
                pBVar34 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pVVar7 = (Vertex *)pBVar34[local_c8].mName._M_string_length;
                if (pVVar7 < (Vertex *)0x400) {
                  paVar32 = ppaVar31[uVar38];
                  (paVar32->mName).length = (ai_uint32)pVVar7;
                  local_b8 = pVVar7;
                  memcpy((paVar32->mName).data,pBVar34[local_c8].mName._M_dataplus._M_p,
                         (size_t)pVVar7);
                  (paVar32->mName).data[(long)local_b8] = '\0';
                  pBVar34 = (this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                pBVar34[local_c8].bIsUsed = true;
                paVar32 = ppaVar31[uVar38];
                if (paVar32->mNumWeights != 0) {
                  uVar33 = 0;
                  do {
                    paVar32->mWeights[uVar33].mVertexId = *(uint *)(*puVar26 + uVar33 * 8);
                    ppaVar31[uVar38]->mWeights[uVar33].mWeight =
                         *(float *)(*puVar26 + 4 + uVar33 * 8);
                    uVar33 = uVar33 + 1;
                    paVar32 = ppaVar31[uVar38];
                  } while (uVar33 < paVar32->mNumWeights);
                }
                uVar38 = local_cc + 1;
                pBVar34 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pBVar37 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                uVar48 = local_a0;
                puVar26 = local_b0;
                uVar33 = local_c0;
                local_cc = uVar38;
              }
              uVar48 = (ulong)((int)uVar48 + 1);
              uVar25 = ((long)pBVar37 - (long)pBVar34 >> 4) * -0x71c71c71c71c71c7;
            } while (uVar48 <= uVar25 && uVar25 - uVar48 != 0);
          }
        }
      }
      puVar26 = local_60;
      if (*local_60 != 0) {
        lVar46 = *local_60 * 0x18;
        do {
          pvVar8 = *(void **)((long)puVar26 + lVar46 + -0x10);
          if (pvVar8 != (void *)0x0) {
            operator_delete(pvVar8);
          }
          lVar46 = lVar46 + -0x18;
        } while (lVar46 != 0);
      }
      operator_delete__(puVar26);
      uVar38 = local_a4 + 1;
      paVar44 = this->pScene;
    } while (uVar38 < paVar44->mNumMeshes);
  }
  puVar26 = local_68;
  if (*local_68 != 0) {
    lVar46 = *local_68 * 0x18;
    do {
      pvVar8 = *(void **)((long)puVar26 + lVar46 + -0x10);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8);
      }
      lVar46 = lVar46 + -0x18;
    } while (lVar46 != 0);
  }
  operator_delete__(puVar26);
  return;
}

Assistant:

void SMDImporter::CreateOutputMeshes() {
    if (aszTextures.empty()) {
        aszTextures.push_back(std::string());
    }

    // we need to sort all faces by their material index
    // in opposition to other loaders we can be sure that each
    // material is at least used once.
    pScene->mNumMeshes = (unsigned int) aszTextures.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    typedef std::vector<unsigned int> FaceList;
    FaceList* aaiFaces = new FaceList[pScene->mNumMeshes];

    // approximate the space that will be required
    unsigned int iNum = (unsigned int)asTriangles.size() / pScene->mNumMeshes;
    iNum += iNum >> 1;
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aaiFaces[i].reserve(iNum);
    }

    // collect all faces
    iNum = 0;
    for (std::vector<SMD::Face>::const_iterator
            iFace =  asTriangles.begin();
            iFace != asTriangles.end();++iFace,++iNum) {
        if (UINT_MAX == (*iFace).iTexture) {
            aaiFaces[(*iFace).iTexture].push_back( 0 );
        } else if ((*iFace).iTexture >= aszTextures.size()) {
            ASSIMP_LOG_INFO("[SMD/VTA] Material index overflow in face");
            aaiFaces[(*iFace).iTexture].push_back((unsigned int)aszTextures.size()-1);
        } else {
            aaiFaces[(*iFace).iTexture].push_back(iNum);
        }
    }

    // now create the output meshes
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh*& pcMesh = pScene->mMeshes[i] = new aiMesh();
        ai_assert(!aaiFaces[i].empty()); // should not be empty ...

        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        pcMesh->mNumVertices = (unsigned int)aaiFaces[i].size()*3;
        pcMesh->mNumFaces = (unsigned int)aaiFaces[i].size();
        pcMesh->mMaterialIndex = i;

        // storage for bones
        typedef std::pair<unsigned int,float> TempWeightListEntry;
        typedef std::vector< TempWeightListEntry > TempBoneWeightList;

        TempBoneWeightList* aaiBones = new TempBoneWeightList[asBones.size()]();

        // try to reserve enough memory without wasting too much
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            aaiBones[iBone].reserve(pcMesh->mNumVertices/asBones.size());
        }

        // allocate storage
        pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
        aiVector3D* pcNormals = pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcVerts = pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];

        aiVector3D* pcUVs = nullptr;
        if (bHasUVs) {
            pcUVs = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNumUVComponents[0] = 2;
        }

        iNum = 0;
        for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
            pcMesh->mFaces[iFace].mIndices = new unsigned int[3];
            pcMesh->mFaces[iFace].mNumIndices = 3;

            // fill the vertices
            unsigned int iSrcFace = aaiFaces[i][iFace];
            SMD::Face& face = asTriangles[iSrcFace];

            *pcVerts++ = face.avVertices[0].pos;
            *pcVerts++ = face.avVertices[1].pos;
            *pcVerts++ = face.avVertices[2].pos;

            // fill the normals
            *pcNormals++ = face.avVertices[0].nor;
            *pcNormals++ = face.avVertices[1].nor;
            *pcNormals++ = face.avVertices[2].nor;

            // fill the texture coordinates
            if (pcUVs) {
                *pcUVs++ = face.avVertices[0].uv;
                *pcUVs++ = face.avVertices[1].uv;
                *pcUVs++ = face.avVertices[2].uv;
            }

            for (unsigned int iVert = 0; iVert < 3;++iVert) {
                float fSum = 0.0f;
                for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone)  {
                    TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];

                    // FIX: The second check is here just to make sure we won't
                    // assign more than one weight to a single vertex index
                    if (pairval.first >= asBones.size() || pairval.first == face.avVertices[iVert].iParentNode) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The bone index will be ignored, the weight will be assigned "
                            "to the vertex' parent node");
                        continue;
                    }
                    aaiBones[pairval.first].push_back(TempWeightListEntry(iNum,pairval.second));
                    fSum += pairval.second;
                }
                // ******************************************************************
                // If the sum of all vertex weights is not 1.0 we must assign
                // the rest to the vertex' parent node. Well, at least the doc says
                // we should ...
                // FIX: We use 0.975 as limit, floating-point inaccuracies seem to
                // be very strong in some SMD exporters. Furthermore it is possible
                // that the parent of a vertex is 0xffffffff (if the corresponding
                // entry in the file was unreadable)
                // ******************************************************************
                if (fSum < 0.975f && face.avVertices[iVert].iParentNode != UINT_MAX) {
                    if (face.avVertices[iVert].iParentNode >= asBones.size()) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The index of the vertex parent bone is invalid. "
                            "The remaining weights will be normalized to 1.0");

                        if (fSum) {
                            fSum = 1 / fSum;
                            for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone) {
                                TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];
                                if (pairval.first >= asBones.size()) {
                                    continue;
                                }
                                aaiBones[pairval.first].back().second *= fSum;
                            }
                        }
                    } else {
                        aaiBones[face.avVertices[iVert].iParentNode].push_back(
                            TempWeightListEntry(iNum,1.0f-fSum));
                    }
                }
                pcMesh->mFaces[iFace].mIndices[iVert] = iNum++;
            }
        }

        // now build all bones of the mesh
        iNum = 0;
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            if (!aaiBones[iBone].empty())++iNum;
        }

        if (iNum) {
            pcMesh->mNumBones = iNum;
            pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
            iNum = 0;
            for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
                if (aaiBones[iBone].empty()) {
                    continue;
                }
                aiBone*& bone = pcMesh->mBones[iNum] = new aiBone();

                bone->mNumWeights = (unsigned int)aaiBones[iBone].size();
                bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                bone->mOffsetMatrix = asBones[iBone].mOffsetMatrix;
                bone->mName.Set( asBones[iBone].mName );

                asBones[iBone].bIsUsed = true;

                for (unsigned int iWeight = 0; iWeight < bone->mNumWeights;++iWeight) {
                    bone->mWeights[iWeight].mVertexId = aaiBones[iBone][iWeight].first;
                    bone->mWeights[iWeight].mWeight = aaiBones[iBone][iWeight].second;
                }
                ++iNum;
            }
        }
        delete[] aaiBones;
    }
    delete[] aaiFaces;
}